

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  ulong *puVar1;
  uint *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  int *piVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  ulong uVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_3a8;
  double local_370;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  undefined1 local_1a8 [29];
  undefined3 uStack_18b;
  undefined1 auStack_188 [13];
  undefined8 local_178;
  cpp_dec_float<50U,_int,_void> local_168;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  ulong local_108;
  uint local_f8 [2];
  uint auStack_f0 [2];
  uint local_e8 [2];
  uint auStack_e0 [2];
  uint local_d8 [4];
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78 [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  ::soplex::infinity::__tls_init();
  local_370 = *(double *)(in_FS_OFFSET + -8);
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems[8] = 0;
  local_168.data._M_elems[9] = 0;
  local_168.exp = 0;
  local_168.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,local_370);
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1e8,0.0);
  ::soplex::infinity::__tls_init();
  local_228.fpclass = cpp_dec_float_finite;
  local_228.prec_elem = 10;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems._24_5_ = 0;
  local_228.data._M_elems[7]._1_3_ = 0;
  local_228.data._M_elems._32_5_ = 0;
  local_228.data._M_elems[9]._1_3_ = 0;
  local_228.exp = 0;
  local_228.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_228,local_370);
  local_2e8.fpclass = cpp_dec_float_finite;
  local_2e8.prec_elem = 10;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems._24_5_ = 0;
  local_2e8.data._M_elems[7]._1_3_ = 0;
  local_2e8.data._M_elems._32_5_ = 0;
  local_2e8.data._M_elems[9]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_2e8,0.0);
  ::soplex::infinity::__tls_init();
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems._24_5_ = 0;
  local_268.data._M_elems[7]._1_3_ = 0;
  local_268.data._M_elems._32_5_ = 0;
  local_268.data._M_elems[9]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_268,local_370);
  local_328.fpclass = cpp_dec_float_finite;
  local_328.prec_elem = 10;
  local_328.data._M_elems[0] = 0;
  local_328.data._M_elems[1] = 0;
  local_328.data._M_elems[2] = 0;
  local_328.data._M_elems[3] = 0;
  local_328.data._M_elems[4] = 0;
  local_328.data._M_elems[5] = 0;
  local_328.data._M_elems._24_5_ = 0;
  local_328.data._M_elems[7]._1_3_ = 0;
  local_328.data._M_elems[8] = 0;
  local_328.data._M_elems[9] = 0;
  local_328.exp = 0;
  local_328.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_328,0.0);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar10 = 0x30;
    lVar11 = 0;
    do {
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3a8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar10 + -0x10);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x30);
      local_3a8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_3a8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x20);
      local_3a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_3a8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_3a8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8);
      local_3a8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar10 + -4);
      local_3a8._48_8_ = *(ulong *)((long)&(pnVar3->m_backend).data + lVar10);
      if ((local_3a8.neg == true) && ((int)local_3a8._48_8_ != 0 || local_3a8.data._M_elems[0] != 0)
         ) {
        local_3a8.neg = false;
      }
      puVar1 = (ulong *)((long)&(pnVar3->m_backend).data + lVar10);
      local_368.data._M_elems._0_8_ = puVar1[-6];
      local_368.data._M_elems._8_8_ = puVar1[-5];
      local_368.data._M_elems._16_8_ = puVar1[-4];
      local_368.data._M_elems._24_8_ = puVar1[-3];
      local_368.data._M_elems._32_8_ = puVar1[-2];
      local_368.exp = (int)puVar1[-1];
      local_368.neg = *(bool *)((long)puVar1 + -4);
      local_368._48_8_ = *puVar1;
      if ((local_368.neg == true) && ((int)local_368._48_8_ != 0 || local_368.data._M_elems[0] != 0)
         ) {
        local_368.neg = false;
      }
      local_c8 = local_368.data._M_elems._0_8_;
      uStack_c0 = local_368.data._M_elems._8_8_;
      local_b8 = local_368.data._M_elems._16_8_;
      uStack_b0 = local_368.data._M_elems._24_8_;
      local_a8 = local_368.data._M_elems._32_8_;
      local_98 = (uint  [2])local_3a8.data._M_elems._0_8_;
      auStack_90 = (uint  [2])local_3a8.data._M_elems._8_8_;
      local_88 = (uint  [2])local_3a8.data._M_elems._16_8_;
      auStack_80 = (uint  [2])local_3a8.data._M_elems._24_8_;
      local_78._0_8_ = local_3a8.data._M_elems._32_8_;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj(&local_68,
            &this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)lVar11);
      local_2a8.data._M_elems[8] = local_68.m_backend.data._M_elems[8];
      local_2a8.data._M_elems[9] = local_68.m_backend.data._M_elems[9];
      local_2a8.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
      local_2a8.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
      local_2a8.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
      local_2a8.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
      local_2a8.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
      local_2a8.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
      local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
      local_2a8.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
      auVar5 = (undefined1  [16])local_2a8.data._M_elems._0_16_;
      local_2a8.exp = local_68.m_backend.exp;
      local_2a8.neg = local_68.m_backend.neg;
      local_2a8.fpclass = local_68.m_backend.fpclass;
      local_2a8.prec_elem = local_68.m_backend.prec_elem;
      if ((local_68.m_backend.neg == true) &&
         (local_2a8.data._M_elems[0] = local_68.m_backend.data._M_elems[0],
         local_68.m_backend.fpclass != 0 || local_2a8.data._M_elems[0] != 0)) {
        local_2a8.neg = false;
      }
      local_2a8.data._M_elems._0_16_ = auVar5;
      ::soplex::infinity::__tls_init();
      local_178._0_4_ = cpp_dec_float_finite;
      local_178._4_4_ = 10;
      local_1a8._0_16_ = (undefined1  [16])0x0;
      local_1a8._16_13_ = SUB1613((undefined1  [16])0x0,0);
      uStack_18b = 0;
      auStack_188 = SUB1613((undefined1  [16])0x0,3);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_1a8,local_370);
      if (((local_3a8.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_178 != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_3a8,(cpp_dec_float<50U,_int,_void> *)local_1a8), iVar6 < 0)) {
        uVar7 = 0;
        if ((local_228.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN)) {
          uVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_228,&local_3a8);
          uVar7 = uVar7 >> 0x1f;
        }
        bVar12 = (char)uVar7 != '\0';
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_228;
        }
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_228.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_228.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_228.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_228.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_228;
        }
        local_228.exp = pcVar9->exp;
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_228;
        }
        local_228.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
        uVar13 = ~uVar13 & local_3a8._48_8_ | local_228._48_8_ & uVar13;
        local_228.fpclass = (int)uVar13;
        local_228.prec_elem = (int)(uVar13 >> 0x20);
        bVar12 = false;
        if ((local_2e8.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_2e8,&local_3a8);
          bVar12 = 0 < iVar6;
        }
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_2e8;
        }
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_2e8.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_2e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_2e8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_2e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_2e8;
        }
        local_2e8.exp = pcVar9->exp;
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_2e8;
        }
        local_2e8.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)((uint)bVar12 << 0x1f) >> 0x1f,(int)((uint)bVar12 << 0x1f) >> 0x1f);
        local_2e8._48_8_ = ~uVar13 & local_3a8._48_8_ | local_2e8._48_8_ & uVar13;
      }
      ::soplex::infinity::__tls_init();
      local_178._0_4_ = cpp_dec_float_finite;
      local_178._4_4_ = 10;
      local_1a8._0_16_ = (undefined1  [16])0x0;
      local_1a8._16_13_ = SUB1613((undefined1  [16])0x0,0);
      uStack_18b = 0;
      auStack_188 = SUB1613((undefined1  [16])0x0,3);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_1a8,local_370);
      if (((local_368.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_178 != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_368,(cpp_dec_float<50U,_int,_void> *)local_1a8), iVar6 < 0)) {
        uVar7 = 0;
        if ((local_228.fpclass != cpp_dec_float_NaN) &&
           (uVar7 = 0, local_368.fpclass != cpp_dec_float_NaN)) {
          uVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_228,&local_368);
          uVar7 = uVar7 >> 0x1f;
        }
        bVar12 = (char)uVar7 != '\0';
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_228;
        }
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_228.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_228.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_228.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_228.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_228.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_228.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_228.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_228;
        }
        local_228.exp = pcVar9->exp;
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_228;
        }
        local_228.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
        uVar13 = ~uVar13 & local_368._48_8_ | local_228._48_8_ & uVar13;
        local_228.fpclass = (int)uVar13;
        local_228.prec_elem = (int)(uVar13 >> 0x20);
        bVar12 = false;
        if ((local_2e8.fpclass != cpp_dec_float_NaN) && (local_368.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_2e8,&local_368);
          bVar12 = 0 < iVar6;
        }
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_2e8;
        }
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_2e8.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_2e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_2e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_2e8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_2e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_2e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_2e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_2e8;
        }
        local_2e8.exp = pcVar9->exp;
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_2e8;
        }
        local_2e8.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)((uint)bVar12 << 0x1f) >> 0x1f,(int)((uint)bVar12 << 0x1f) >> 0x1f);
        uVar13 = ~uVar13 & local_368._48_8_ | local_2e8._48_8_ & uVar13;
        local_2e8.fpclass = (int)uVar13;
        local_2e8.prec_elem = (int)(uVar13 >> 0x20);
      }
      uVar7 = 0;
      if ((local_168.fpclass != cpp_dec_float_NaN) &&
         (uVar7 = 0, local_2a8.fpclass != cpp_dec_float_NaN)) {
        uVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_168,&local_2a8);
        uVar7 = uVar7 >> 0x1f;
      }
      bVar12 = (char)uVar7 != '\0';
      pcVar9 = &local_2a8;
      if (bVar12) {
        pcVar9 = &local_168;
      }
      local_168.data._M_elems._32_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 8);
      uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
      local_168.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
      local_168.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_168.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar9->data)._M_elems;
      piVar8 = &local_2a8.exp;
      if (bVar12) {
        piVar8 = (int *)((long)&local_168 + 0x28);
      }
      local_168.exp = *piVar8;
      pcVar9 = &local_2a8;
      if (bVar12) {
        pcVar9 = &local_168;
      }
      local_168.neg = pcVar9->neg;
      uVar13 = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
      local_168._48_8_ = ~uVar13 & local_2a8._48_8_ | local_168._48_8_ & uVar13;
      bVar12 = false;
      if ((local_1e8.fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN)) {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_1e8,&local_2a8);
        bVar12 = 0 < iVar6;
      }
      pcVar9 = &local_2a8;
      if (bVar12) {
        pcVar9 = &local_1e8;
      }
      uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
      local_1e8.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
      local_1e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
      local_1e8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
      local_1e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
      piVar8 = &local_2a8.exp;
      if (bVar12) {
        piVar8 = &local_1e8.exp;
      }
      local_1e8.exp = *piVar8;
      pcVar9 = &local_2a8;
      if (bVar12) {
        pcVar9 = &local_1e8;
      }
      local_1e8.neg = pcVar9->neg;
      uVar13 = CONCAT44((int)((uint)bVar12 << 0x1f) >> 0x1f,(int)((uint)bVar12 << 0x1f) >> 0x1f);
      local_1e8._48_8_ = ~uVar13 & local_2a8._48_8_ | local_1e8._48_8_ & uVar13;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar11 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar10 = 0x30;
    lVar11 = 0;
    do {
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3a8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar10 + -0x10);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x30);
      local_3a8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_3a8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x20);
      local_3a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_3a8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_3a8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8);
      local_3a8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar10 + -4);
      local_3a8._48_8_ = *(ulong *)((long)&(pnVar3->m_backend).data + lVar10);
      if ((local_3a8.neg == true) && ((int)local_3a8._48_8_ != 0 || local_3a8.data._M_elems[0] != 0)
         ) {
        local_3a8.neg = false;
      }
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_368.data._M_elems._32_8_ = *(ulong *)((long)&(pnVar3->m_backend).data + lVar10 + -0x10);
      puVar1 = (ulong *)((long)&(pnVar3->m_backend).data + lVar10 + -0x30);
      local_368.data._M_elems._0_8_ = *puVar1;
      local_368.data._M_elems._8_8_ = puVar1[1];
      puVar1 = (ulong *)((long)&(pnVar3->m_backend).data + lVar10 + -0x20);
      local_368.data._M_elems._16_8_ = *puVar1;
      local_368.data._M_elems._24_8_ = puVar1[1];
      local_368.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8);
      local_368.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar10 + -4);
      local_368._48_8_ = *(ulong *)((long)&(pnVar3->m_backend).data + lVar10);
      if ((local_368.neg == true) && ((int)local_368._48_8_ != 0 || local_368.data._M_elems[0] != 0)
         ) {
        local_368.neg = false;
      }
      local_128 = local_368.data._M_elems._0_8_;
      uStack_120 = local_368.data._M_elems._8_8_;
      local_118 = local_368.data._M_elems._16_8_;
      uStack_110 = local_368.data._M_elems._24_8_;
      local_108 = local_368.data._M_elems._32_8_;
      local_f8 = (uint  [2])local_3a8.data._M_elems._0_8_;
      auStack_f0 = (uint  [2])local_3a8.data._M_elems._8_8_;
      local_e8 = (uint  [2])local_3a8.data._M_elems._16_8_;
      auStack_e0 = (uint  [2])local_3a8.data._M_elems._24_8_;
      local_d8._0_8_ = local_3a8.data._M_elems._32_8_;
      ::soplex::infinity::__tls_init();
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems[8] = 0;
      local_2a8.data._M_elems[9] = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_2a8,local_370);
      if (((local_3a8.fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_3a8,&local_2a8), 0 < iVar6)) {
        uVar7 = 0;
        if ((local_268.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN)) {
          uVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_268,&local_3a8);
          uVar7 = uVar7 >> 0x1f;
        }
        bVar12 = (char)uVar7 != '\0';
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_268;
        }
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_268.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_268.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_268.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_268.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_268.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_268;
        }
        local_268.exp = pcVar9->exp;
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_268;
        }
        local_268.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
        uVar13 = ~uVar13 & local_3a8._48_8_ | local_268._48_8_ & uVar13;
        local_268.fpclass = (int)uVar13;
        local_268.prec_elem = (int)(uVar13 >> 0x20);
        bVar12 = false;
        if ((local_328.fpclass != cpp_dec_float_NaN) && (local_3a8.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_328,&local_3a8);
          bVar12 = 0 < iVar6;
        }
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_328;
        }
        local_328.data._M_elems._32_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_328.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_328.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_328.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_328.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar9->data)._M_elems;
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_328;
        }
        local_328.exp = pcVar9->exp;
        pcVar9 = &local_3a8;
        if (bVar12) {
          pcVar9 = &local_328;
        }
        local_328.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)((uint)bVar12 << 0x1f) >> 0x1f,(int)((uint)bVar12 << 0x1f) >> 0x1f);
        local_328._48_8_ = ~uVar13 & local_3a8._48_8_ | local_328._48_8_ & uVar13;
      }
      ::soplex::infinity::__tls_init();
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 10;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems._24_5_ = 0;
      local_2a8.data._M_elems[7]._1_3_ = 0;
      local_2a8.data._M_elems[8] = 0;
      local_2a8.data._M_elems[9] = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_2a8,local_370);
      if (((local_368.fpclass != cpp_dec_float_NaN) && (local_2a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_368,&local_2a8), iVar6 < 0)) {
        uVar7 = 0;
        if ((local_268.fpclass != cpp_dec_float_NaN) && (local_368.fpclass != cpp_dec_float_NaN)) {
          uVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_268,&local_368);
          uVar7 = uVar7 >> 0x1f;
        }
        bVar12 = (char)uVar7 != '\0';
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_268;
        }
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        local_268.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_268.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_268.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_268.data._M_elems._0_8_ = *(undefined8 *)(pcVar9->data)._M_elems;
        local_268.data._M_elems._8_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 2);
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_268;
        }
        local_268.exp = pcVar9->exp;
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_268;
        }
        local_268.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
        uVar13 = ~uVar13 & local_368._48_8_ | local_268._48_8_ & uVar13;
        local_268.fpclass = (int)uVar13;
        local_268.prec_elem = (int)(uVar13 >> 0x20);
        bVar12 = false;
        if ((local_328.fpclass != cpp_dec_float_NaN) && (local_368.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_328,&local_368);
          bVar12 = 0 < iVar6;
        }
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_328;
        }
        local_328.data._M_elems._32_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 8);
        uVar4 = *(undefined8 *)((pcVar9->data)._M_elems + 6);
        local_328.data._M_elems._16_8_ = *(undefined8 *)((pcVar9->data)._M_elems + 4);
        local_328.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_328.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_328.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar9->data)._M_elems;
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_328;
        }
        local_328.exp = pcVar9->exp;
        pcVar9 = &local_368;
        if (bVar12) {
          pcVar9 = &local_328;
        }
        local_328.neg = pcVar9->neg;
        uVar13 = CONCAT44((int)((uint)bVar12 << 0x1f) >> 0x1f,(int)((uint)bVar12 << 0x1f) >> 0x1f);
        local_328._48_8_ = ~uVar13 & local_368._48_8_ | local_328._48_8_ & uVar13;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar11 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_3a8.data._M_elems[7]._1_3_ = local_2e8.data._M_elems[7]._1_3_;
  local_3a8.data._M_elems._24_5_ = local_2e8.data._M_elems._24_5_;
  local_3a8.data._M_elems[0] = local_2e8.data._M_elems[0];
  local_3a8.data._M_elems[1] = local_2e8.data._M_elems[1];
  local_3a8.data._M_elems[2] = local_2e8.data._M_elems[2];
  local_3a8.data._M_elems[3] = local_2e8.data._M_elems[3];
  local_3a8.data._M_elems[4] = local_2e8.data._M_elems[4];
  local_3a8.data._M_elems[5] = local_2e8.data._M_elems[5];
  local_3a8.data._M_elems[9]._1_3_ = local_2e8.data._M_elems[9]._1_3_;
  local_3a8.data._M_elems._32_5_ = local_2e8.data._M_elems._32_5_;
  local_3a8.exp = local_2e8.exp;
  local_3a8.neg = local_2e8.neg;
  local_3a8.fpclass = local_2e8.fpclass;
  local_3a8.prec_elem = local_2e8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_3a8,&local_228);
  auVar5 = (undefined1  [16])local_328.data._M_elems._0_16_;
  *(undefined8 *)(this->boundrange).m_backend.data._M_elems = local_3a8.data._M_elems._0_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 2) = local_3a8.data._M_elems._8_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 4) = local_3a8.data._M_elems._16_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 6) = local_3a8.data._M_elems._24_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 8) = local_3a8.data._M_elems._32_8_;
  (this->boundrange).m_backend.exp = local_3a8.exp;
  (this->boundrange).m_backend.neg = local_3a8.neg;
  (this->boundrange).m_backend.fpclass = local_3a8.fpclass;
  (this->boundrange).m_backend.prec_elem = local_3a8.prec_elem;
  local_3a8.data._M_elems[7]._1_3_ = local_328.data._M_elems[7]._1_3_;
  local_3a8.data._M_elems._24_5_ = local_328.data._M_elems._24_5_;
  local_3a8.data._M_elems[0] = local_328.data._M_elems[0];
  local_3a8.data._M_elems[1] = local_328.data._M_elems[1];
  local_3a8.data._M_elems[2] = local_328.data._M_elems[2];
  local_3a8.data._M_elems[3] = local_328.data._M_elems[3];
  local_3a8.data._M_elems[4] = local_328.data._M_elems[4];
  local_3a8.data._M_elems[5] = local_328.data._M_elems[5];
  local_3a8.data._M_elems[8] = local_328.data._M_elems[8];
  local_3a8.data._M_elems[9] = local_328.data._M_elems[9];
  local_3a8.exp = local_328.exp;
  local_3a8.neg = local_328.neg;
  local_3a8.fpclass = local_328.fpclass;
  local_3a8.prec_elem = local_328.prec_elem;
  local_328.data._M_elems._0_16_ = auVar5;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_3a8,&local_268);
  *(undefined8 *)(this->siderange).m_backend.data._M_elems = local_3a8.data._M_elems._0_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 2) = local_3a8.data._M_elems._8_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 4) = local_3a8.data._M_elems._16_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 6) = local_3a8.data._M_elems._24_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 8) = local_3a8.data._M_elems._32_8_;
  (this->siderange).m_backend.exp = local_3a8.exp;
  (this->siderange).m_backend.neg = local_3a8.neg;
  (this->siderange).m_backend.fpclass = local_3a8.fpclass;
  (this->siderange).m_backend.prec_elem = local_3a8.prec_elem;
  local_3a8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
  local_3a8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
  local_3a8.data._M_elems[0] = local_1e8.data._M_elems[0];
  local_3a8.data._M_elems[1] = local_1e8.data._M_elems[1];
  local_3a8.data._M_elems[2] = local_1e8.data._M_elems[2];
  local_3a8.data._M_elems[3] = local_1e8.data._M_elems[3];
  local_3a8.data._M_elems[4] = local_1e8.data._M_elems[4];
  local_3a8.data._M_elems[5] = local_1e8.data._M_elems[5];
  local_3a8.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
  local_3a8.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
  local_3a8.exp = local_1e8.exp;
  local_3a8.neg = local_1e8.neg;
  local_3a8.fpclass = local_1e8.fpclass;
  local_3a8.prec_elem = local_1e8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_3a8,&local_168);
  *(undefined8 *)(this->objrange).m_backend.data._M_elems = local_3a8.data._M_elems._0_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 2) = local_3a8.data._M_elems._8_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 4) = local_3a8.data._M_elems._16_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 6) = local_3a8.data._M_elems._24_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 8) = local_3a8.data._M_elems._32_8_;
  (this->objrange).m_backend.exp = local_3a8.exp;
  (this->objrange).m_backend.neg = local_3a8.neg;
  (this->objrange).m_backend.fpclass = local_3a8.fpclass;
  (this->objrange).m_backend.prec_elem = local_3a8.prec_elem;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}